

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDarPhase(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Cex_t *p;
  int iVar1;
  int iVar2;
  int nRegsOld;
  Aig_Man_t *p_00;
  Gia_Man_t *pAig_00;
  char *pcVar3;
  int iPo;
  Gia_Man_t *pGia;
  Aig_Man_t *pAig;
  Abc_Cex_t *pCexNew;
  int local_50;
  int fVerbose;
  int c;
  int fUpdateCex;
  int fPrint;
  int fIgnore;
  int nPref;
  int nFrames;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk = (Abc_Ntk_t *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  pNtkRes = Abc_FrameReadNtk(pAbc);
  fIgnore = 0;
  fPrint = 0;
  fUpdateCex = 0;
  c = 0;
  fVerbose = 0;
  pCexNew._4_4_ = 0;
  Extra_UtilGetoptReset();
LAB_00249494:
  do {
    local_50 = Extra_UtilGetopt(argv_local._4_4_,(char **)pNtk,"FPipcvh");
    if (local_50 == -1) {
      if (pNtkRes == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsStrash(pNtkRes);
      if (iVar1 == 0) {
        Abc_Print(-1,"Only works for structrally hashed networks.\n");
        return 1;
      }
      if (fVerbose != 0) {
        if (pAStack_18->pCex == (Abc_Cex_t *)0x0) {
          Abc_Print(-1,"Counter-example is not available.\n");
          return 1;
        }
        iVar1 = pAStack_18->pCex->nPis;
        iVar2 = Abc_NtkPiNum(pNtkRes);
        if (iVar1 % iVar2 != 0) {
          Abc_Print(-1,"PI count of the CEX is not a multiple of PI count of the current AIG.\n");
          return 1;
        }
        p = pAStack_18->pCex;
        iVar1 = Abc_NtkPiNum(pNtkRes);
        iVar2 = Abc_NtkPoNum(pNtkRes);
        nRegsOld = Abc_NtkLatchNum(pNtkRes);
        pAig = (Aig_Man_t *)Abc_CexTransformPhase(p,iVar1,iVar2,nRegsOld);
        p_00 = Abc_NtkToDar(pNtkRes,0,1);
        pAig_00 = Gia_ManFromAig(p_00);
        iVar1 = Gia_ManSetFailedPoCex(pAig_00,(Abc_Cex_t *)pAig);
        Gia_ManStop(pAig_00);
        Aig_ManStop(p_00);
        if (iVar1 == -1) {
          Abc_Print(-1,"The counter-example does not fail any of the outputs of the original AIG.\n"
                   );
          return 1;
        }
        Abc_FrameReplaceCex(pAStack_18,(Abc_Cex_t **)&pAig);
        return 0;
      }
      iVar1 = Abc_NtkLatchNum(pNtkRes);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      if (c != 0) {
        Abc_NtkPhaseAbstract(pNtkRes,0,fPrint,fUpdateCex,1,pCexNew._4_4_);
        return 0;
      }
      _nPref = Abc_NtkPhaseAbstract(pNtkRes,fIgnore,fPrint,fUpdateCex,0,pCexNew._4_4_);
      if (_nPref == (Abc_Ntk_t *)0x0) {
        return 0;
      }
      Abc_FrameReplaceCurrentNetwork(pAStack_18,_nPref);
      return 0;
    }
    switch(local_50) {
    case 0x46:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00249823;
      }
      fIgnore = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = fIgnore;
      break;
    default:
      goto LAB_00249823;
    case 0x50:
      if (argv_local._4_4_ <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_00249823;
      }
      fPrint = atoi(*(char **)(pNtk->nObjCounts + (long)globalUtilOptind * 2 + -0x18));
      iVar1 = fPrint;
      break;
    case 99:
      fVerbose = fVerbose ^ 1;
      goto LAB_00249494;
    case 0x68:
      goto LAB_00249823;
    case 0x69:
      fUpdateCex = fUpdateCex ^ 1;
      goto LAB_00249494;
    case 0x70:
      c = c ^ 1;
      goto LAB_00249494;
    case 0x76:
      pCexNew._4_4_ = pCexNew._4_4_ ^ 1;
      goto LAB_00249494;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00249823:
      Abc_Print(-2,"usage: phase [-FP <num>] [-ipcvh]\n");
      Abc_Print(-2,"\t         performs sequential cleanup of the current network\n");
      Abc_Print(-2,"\t         by removing nodes and latches that do not feed into POs\n");
      Abc_Print(-2,"\t-F num : the number of frames to abstract [default = %d]\n",
                (ulong)(uint)fIgnore);
      Abc_Print(-2,"\t-P num : the number of prefix frames to skip [default = %d]\n",
                (ulong)(uint)fPrint);
      pcVar3 = "no";
      if (fUpdateCex != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-i     : toggle ignoring the initial state [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (c != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle printing statistics about generators [default = %s]\n",pcVar3)
      ;
      Abc_Print(-2,"\t-c     : update the current CEX derived for a new AIG after \"phase\"\n");
      pcVar3 = "no";
      if (fVerbose != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t         to match the current AIG (the one before \"phase\") [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (pCexNew._4_4_ != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandDarPhase( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int nFrames, nPref;
    int fIgnore;
    int fPrint;
    int fUpdateCex;
    int c, fVerbose;
    extern Abc_Ntk_t * Abc_NtkPhaseAbstract( Abc_Ntk_t * pNtk, int nFrames, int nPref, int fIgnore, int fPrint, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nFrames     = 0;
    nPref       = 0;
    fIgnore     = 0;
    fPrint      = 0;
    fUpdateCex  = 0;
    fVerbose    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FPipcvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFrames < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            nPref = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nPref < 0 )
                goto usage;
            break;
        case 'i':
            fIgnore ^= 1;
            break;
        case 'p':
            fPrint ^= 1;
            break;
        case 'c':
            fUpdateCex ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Only works for structrally hashed networks.\n" );
        return 1;
    }
    if ( fUpdateCex )
    {
        Abc_Cex_t * pCexNew;
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "Counter-example is not available.\n" );
            return 1;
        }
        if ( pAbc->pCex->nPis % Abc_NtkPiNum(pNtk) != 0 )
        {
            Abc_Print( -1, "PI count of the CEX is not a multiple of PI count of the current AIG.\n" );
            return 1;
        }
        pCexNew = Abc_CexTransformPhase( pAbc->pCex, Abc_NtkPiNum(pNtk), Abc_NtkPoNum(pNtk), Abc_NtkLatchNum(pNtk) );
        {
            Aig_Man_t * pAig = Abc_NtkToDar( pNtk, 0, 1 );
            Gia_Man_t * pGia = Gia_ManFromAig( pAig );
            int iPo = Gia_ManSetFailedPoCex( pGia, pCexNew );
            Gia_ManStop( pGia );
            Aig_ManStop( pAig );
            if ( iPo == -1 )
            {
                Abc_Print( -1, "The counter-example does not fail any of the outputs of the original AIG.\n" );
                return 1;
            }
        }
        Abc_FrameReplaceCex( pAbc, &pCexNew );
        return 0;
    }
    if ( !Abc_NtkLatchNum(pNtk) )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( fPrint )
    {
        Abc_NtkPhaseAbstract( pNtk, 0, nPref, fIgnore, 1, fVerbose );
        return 0;
    }
    // modify the current network
    pNtkRes = Abc_NtkPhaseAbstract( pNtk, nFrames, nPref, fIgnore, 0, fVerbose );
    if ( pNtkRes == NULL )
    {
//        Abc_Print( -1, "Phase abstraction has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: phase [-FP <num>] [-ipcvh]\n" );
    Abc_Print( -2, "\t         performs sequential cleanup of the current network\n" );
    Abc_Print( -2, "\t         by removing nodes and latches that do not feed into POs\n" );
    Abc_Print( -2, "\t-F num : the number of frames to abstract [default = %d]\n", nFrames );
    Abc_Print( -2, "\t-P num : the number of prefix frames to skip [default = %d]\n", nPref );
    Abc_Print( -2, "\t-i     : toggle ignoring the initial state [default = %s]\n", fIgnore? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle printing statistics about generators [default = %s]\n", fPrint? "yes": "no" );
    Abc_Print( -2, "\t-c     : update the current CEX derived for a new AIG after \"phase\"\n" );
    Abc_Print( -2, "\t         to match the current AIG (the one before \"phase\") [default = %s]\n", fUpdateCex? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}